

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O2

void Parser_freeNodeContent(IXML_Node *nodeptr)

{
  if (nodeptr != (IXML_Node *)0x0) {
    free(nodeptr->nodeName);
    free(nodeptr->nodeValue);
    free(nodeptr->namespaceURI);
    free(nodeptr->prefix);
    free(nodeptr->localName);
    return;
  }
  return;
}

Assistant:

void Parser_freeNodeContent(IXML_Node *nodeptr)
{
	if (nodeptr == NULL) {
		return;
	}

	if (nodeptr->nodeName != NULL) {
		free(nodeptr->nodeName);
	}

	if (nodeptr->nodeValue != NULL) {
		free(nodeptr->nodeValue);
	}

	if (nodeptr->namespaceURI != NULL) {
		free(nodeptr->namespaceURI);
	}

	if (nodeptr->prefix != NULL) {
		free(nodeptr->prefix);
	}

	if (nodeptr->localName != NULL) {
		free(nodeptr->localName);
	}
}